

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.h
# Opt level: O0

void __thiscall BamTools::SamSequence::~SamSequence(SamSequence *this)

{
  string *in_RDI;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *unaff_retaddr;
  
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::~vector
            (unaff_retaddr);
  std::__cxx11::string::~string(in_RDI + 0xa0);
  std::__cxx11::string::~string(in_RDI + 0x80);
  std::__cxx11::string::~string(in_RDI + 0x60);
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

struct API_EXPORT SamSequence
{

    // ctor & dtor
    SamSequence();
    SamSequence(const std::string& name, const int& length);
    SamSequence(const std::string& name, const std::string& length);

    // query/modify entire sequence
    void Clear();  // clears all contents

    // convenience query methods
    bool HasAssemblyID() const;  // returns true if sequence has an assembly ID
    bool HasChecksum() const;    // returns true if sequence has an MD5 checksum
    bool HasLength() const;      // returns true if sequence has a length
    bool HasName() const;        // returns true if sequence has a name
    bool HasSpecies() const;     // returns true if sequence has a species ID
    bool HasURI() const;         // returns true if sequence has a URI

    // data members
    std::string AssemblyID;                   // AS:<AssemblyID>
    std::string Checksum;                     // M5:<Checksum>
    std::string Length;                       // LN:<Length>      *Required for valid SAM header*
    std::string Name;                         // SN:<Name>        *Required for valid SAM header*
    std::string Species;                      // SP:<Species>
    std::string URI;                          // UR:<URI>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags
}